

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

art_val_t * art_find(art_t *art,art_key_chunk_t *key)

{
  byte bVar1;
  art_inner_node_t *node;
  art_val_t *paVar2;
  uint8_t offset;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  
  node = (art_inner_node_t *)art->root;
  if (node == (art_inner_node_t *)0x0) {
    return (art_val_t *)0x0;
  }
  if (((ulong)node & 1) == 0) {
    bVar7 = 0;
    do {
      bVar1 = node->prefix_size;
      uVar5 = (ulong)(byte)(6 - bVar7);
      if (bVar1 <= (byte)(6 - bVar7)) {
        uVar5 = (ulong)bVar1;
      }
      bVar4 = (byte)uVar5;
      if (bVar4 == 0) {
        bVar4 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (node->prefix[uVar6] != key[uVar6 + bVar7]) {
            bVar4 = (byte)uVar6;
            break;
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      if (bVar4 != bVar1) {
        return (art_val_t *)0x0;
      }
      node = (art_inner_node_t *)art_find_child(node,key[(ulong)bVar1 + (ulong)bVar7]);
      if (node == (art_inner_node_t *)0x0) {
        return (art_val_t *)0x0;
      }
      bVar7 = bVar7 + bVar1 + 1;
    } while (((ulong)node & 1) == 0);
    paVar2 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
    if (5 < bVar7) {
      return paVar2;
    }
  }
  else {
    paVar2 = (art_val_t *)((ulong)node & 0xfffffffffffffffe);
  }
  lVar3 = 0;
  while (paVar2->key[lVar3] == key[lVar3]) {
    lVar3 = lVar3 + 1;
    if (lVar3 == 6) {
      return paVar2;
    }
  }
  if (lVar3 != 6) {
    return (art_val_t *)0x0;
  }
  return paVar2;
}

Assistant:

art_val_t *art_find(const art_t *art, const art_key_chunk_t *key) {
    if (art->root == NULL) {
        return NULL;
    }
    return art_find_at(art->root, key, 0);
}